

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanscalar.cpp
# Opt level: O1

string * __thiscall
YAML::ScanScalar_abi_cxx11_
          (string *__return_storage_ptr__,YAML *this,Stream *INPUT,ScanScalarParams *params)

{
  CharacterSet CVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  RegEx *pRVar8;
  RegEx *pRVar9;
  RegEx *pRVar10;
  Exception *pEVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined7 uVar14;
  Stream *in;
  byte *pbVar15;
  uint uVar16;
  char cVar17;
  bool bVar18;
  string local_a0;
  RegEx *local_80;
  undefined4 local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  Mark local_58;
  ulong local_48;
  RegEx *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  bVar18 = INPUT->m_charSet == utf16be;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined1 *)
   &(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = 0;
  if (INPUT->m_input != (istream *)0x0) goto LAB_00722e57;
  if (Exp::Empty()::e == '\0') goto LAB_00723899;
LAB_00722e4d:
  INPUT->m_input = (istream *)Exp::Empty()::e;
LAB_00722e57:
  local_70 = 0;
  local_40 = (RegEx *)0xffffffffffffffff;
  local_48 = 0;
  local_60 = 0;
  local_68 = 0;
  bVar3 = false;
  do {
    bVar4 = Stream::operator_cast_to_bool((Stream *)this);
    cVar17 = (char)__return_storage_ptr__;
    if (!bVar4) break;
    local_80 = (RegEx *)__return_storage_ptr__->_M_string_length;
    while( true ) {
      local_a0._M_dataplus._M_p = (pointer)0x0;
      local_a0._M_string_length = (size_type)this;
      iVar6 = RegEx::Match<YAML::StreamCharSource>
                        ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_a0);
      if (-1 < iVar6) break;
      pRVar8 = Exp::Break();
      local_a0._M_dataplus._M_p = (pointer)0x0;
      local_a0._M_string_length = (size_type)this;
      iVar6 = RegEx::Match<YAML::StreamCharSource>(pRVar8,(StreamCharSource *)&local_a0);
      if ((-1 < iVar6) || (bVar4 = Stream::operator_cast_to_bool((Stream *)this), !bVar4)) break;
      if (*(int *)(this + 0x10) == 0) {
        if ((Exp::DocIndicator()::e == '\0') &&
           (iVar6 = __cxa_guard_acquire(&Exp::DocIndicator()::e), iVar6 != 0)) {
          pRVar8 = Exp::DocStart();
          pRVar9 = Exp::DocEnd();
          operator|((RegEx *)Exp::DocIndicator()::e,pRVar8,pRVar9);
          __cxa_atexit(RegEx::~RegEx,Exp::DocIndicator()::e,&__dso_handle);
          __cxa_guard_release(&Exp::DocIndicator()::e);
        }
        local_a0._M_dataplus._M_p = (pointer)0x0;
        local_a0._M_string_length = (size_type)this;
        iVar6 = RegEx::Match<YAML::StreamCharSource>
                          ((RegEx *)Exp::DocIndicator()::e,(StreamCharSource *)&local_a0);
        if (-1 < iVar6) {
          iVar6 = (int)(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                       super__Deque_impl_data._M_map_size;
          if (iVar6 == 1) break;
          if (iVar6 == 2) {
            pEVar11 = (Exception *)__cxa_allocate_exception(0x40);
            local_58._0_8_ = *(undefined8 *)(this + 8);
            local_58.column = *(int *)(this + 0x10);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"illegal document indicator in scalar","");
            Exception::Exception(pEVar11,&local_58,&local_a0);
            *(undefined ***)pEVar11 = &PTR__BadFile_008899d0;
            __cxa_throw(pEVar11,&ParserException::typeinfo,BadFile::~BadFile);
          }
        }
      }
      if (*(char *)((long)&(INPUT->m_mark).column + 2) == '\\') {
        pRVar8 = Exp::EscBreak();
        local_a0._M_dataplus._M_p = (pointer)0x0;
        local_a0._M_string_length = (size_type)this;
        iVar6 = RegEx::Match<YAML::StreamCharSource>(pRVar8,(StreamCharSource *)&local_a0);
        if (-1 < iVar6) {
          Stream::get((Stream *)this);
          local_80 = (RegEx *)__return_storage_ptr__->_M_string_length;
          local_74 = (undefined4)CONCAT71((int7)((ulong)__return_storage_ptr__ >> 8),1);
          bVar18 = true;
          bVar3 = true;
          local_40 = local_80;
          goto LAB_0072308d;
        }
      }
      cVar5 = Stream::peek((Stream *)this);
      if (cVar5 == *(char *)((long)&(INPUT->m_mark).column + 2)) {
        Exp::Escape_abi_cxx11_(&local_a0,(Exp *)this,in);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        local_80 = (RegEx *)__return_storage_ptr__->_M_string_length;
        bVar18 = true;
        bVar3 = true;
        local_40 = local_80;
      }
      else {
        cVar5 = Stream::get((Stream *)this);
        std::__cxx11::string::push_back(cVar17);
        bVar3 = true;
        bVar18 = true;
        if ((cVar5 != '\t') && (bVar3 = true, bVar18 = true, cVar5 != ' ')) {
          local_80 = (RegEx *)__return_storage_ptr__->_M_string_length;
          bVar3 = true;
        }
      }
    }
    local_74 = 0;
LAB_0072308d:
    bVar4 = Stream::operator_cast_to_bool((Stream *)this);
    if (!bVar4) {
      if ((char)(INPUT->m_mark).pos == '\x01') {
        pEVar11 = (Exception *)__cxa_allocate_exception(0x40);
        local_58._0_8_ = *(undefined8 *)(this + 8);
        local_58.column = *(int *)(this + 0x10);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"illegal EOF in scalar","");
        Exception::Exception(pEVar11,&local_58,&local_a0);
        *(undefined ***)pEVar11 = &PTR__BadFile_008899d0;
        __cxa_throw(pEVar11,&ParserException::typeinfo,BadFile::~BadFile);
      }
LAB_00723114:
      bVar4 = false;
      goto LAB_00723116;
    }
    if (((int)(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_map_size == 1) && (*(int *)(this + 0x10) == 0)) {
      if ((Exp::DocIndicator()::e == '\0') &&
         (iVar6 = __cxa_guard_acquire(&Exp::DocIndicator()::e), iVar6 != 0)) {
        pRVar8 = Exp::DocStart();
        pRVar9 = Exp::DocEnd();
        operator|((RegEx *)Exp::DocIndicator()::e,pRVar8,pRVar9);
        __cxa_atexit(RegEx::~RegEx,Exp::DocIndicator()::e,&__dso_handle);
        __cxa_guard_release(&Exp::DocIndicator()::e);
      }
      local_a0._M_dataplus._M_p = (pointer)0x0;
      local_a0._M_string_length = (size_type)this;
      iVar6 = RegEx::Match<YAML::StreamCharSource>
                        ((RegEx *)Exp::DocIndicator()::e,(StreamCharSource *)&local_a0);
      if (-1 < iVar6) goto LAB_00723114;
    }
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_a0._M_string_length = (size_type)this;
    iVar6 = RegEx::Match<YAML::StreamCharSource>
                      ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_a0);
    if (-1 < iVar6) {
      if ((char)(INPUT->m_mark).pos == '\x01') {
        Stream::eat((Stream *)this,iVar6);
      }
      goto LAB_00723114;
    }
    if (INPUT->m_charSet == utf16be) {
      if ((RegEx *)__return_storage_ptr__->_M_string_length < local_80) goto LAB_00723884;
      __return_storage_ptr__->_M_string_length = (size_type)local_80;
      *(char *)((long)&local_80->m_op + (long)(__return_storage_ptr__->_M_dataplus)._M_p) = '\0';
    }
    pRVar8 = Exp::Break();
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_a0._M_string_length = (size_type)this;
    iVar6 = RegEx::Match<YAML::StreamCharSource>(pRVar8,(StreamCharSource *)&local_a0);
    Stream::eat((Stream *)this,iVar6);
    while ((cVar5 = Stream::peek((Stream *)this), cVar5 == ' ' &&
           ((*(int *)(this + 0x10) < (INPUT->m_mark).line ||
            (((char)(INPUT->m_mark).column == '\x01' && (!bVar3))))))) {
      local_a0._M_dataplus._M_p = (pointer)0x0;
      local_a0._M_string_length = (size_type)this;
      iVar6 = RegEx::Match<YAML::StreamCharSource>
                        ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_a0);
      if (-1 < iVar6) break;
      Stream::eat((Stream *)this,1);
    }
    if (((char)(INPUT->m_mark).column == '\x01') && (!bVar3)) {
      iVar6 = (INPUT->m_mark).line;
      iVar7 = *(int *)(this + 0x10);
      if (*(int *)(this + 0x10) < iVar6) {
        iVar7 = iVar6;
      }
      (INPUT->m_mark).line = iVar7;
    }
    while( true ) {
      if ((Exp::Blank()::e == '\0') && (iVar6 = __cxa_guard_acquire(&Exp::Blank()::e), iVar6 != 0))
      {
        pRVar8 = Exp::Space();
        pRVar9 = Exp::Tab();
        operator|(&Exp::Blank::e,pRVar8,pRVar9);
        __cxa_atexit(RegEx::~RegEx,&Exp::Blank::e,&__dso_handle);
        __cxa_guard_release(&Exp::Blank()::e);
      }
      local_a0._M_dataplus._M_p = (pointer)0x0;
      local_a0._M_string_length = (size_type)this;
      iVar6 = RegEx::Match<YAML::StreamCharSource>(&Exp::Blank::e,(StreamCharSource *)&local_a0);
      if (iVar6 < 0) break;
      cVar5 = Stream::peek((Stream *)this);
      if (((cVar5 == '\t') && (*(int *)(this + 0x10) < (INPUT->m_mark).line)) &&
         (*(int *)((long)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                          _M_impl.super__Deque_impl_data._M_map_size + 4) == 2)) {
        pEVar11 = (Exception *)__cxa_allocate_exception(0x40);
        local_58._0_8_ = *(undefined8 *)(this + 8);
        local_58.column = *(int *)(this + 0x10);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"illegal tab when looking for indentation","");
        Exception::Exception(pEVar11,&local_58,&local_a0);
        *(undefined ***)pEVar11 = &PTR__BadFile_008899d0;
        __cxa_throw(pEVar11,&ParserException::typeinfo,BadFile::~BadFile);
      }
      if (*(char *)((long)&(INPUT->m_mark).column + 1) != '\x01') break;
      local_a0._M_dataplus._M_p = (pointer)0x0;
      local_a0._M_string_length = (size_type)this;
      iVar6 = RegEx::Match<YAML::StreamCharSource>
                        ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_a0);
      if (-1 < iVar6) break;
      Stream::eat((Stream *)this,1);
    }
    pRVar8 = Exp::Break();
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_a0._M_string_length = (size_type)this;
    iVar6 = RegEx::Match<YAML::StreamCharSource>(pRVar8,(StreamCharSource *)&local_a0);
    if ((Exp::Blank()::e == '\0') && (iVar7 = __cxa_guard_acquire(&Exp::Blank()::e), iVar7 != 0)) {
      local_80 = Exp::Space();
      pRVar8 = Exp::Tab();
      operator|(&Exp::Blank::e,local_80,pRVar8);
      __cxa_atexit(RegEx::~RegEx,&Exp::Blank::e,&__dso_handle);
      __cxa_guard_release(&Exp::Blank()::e);
    }
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_a0._M_string_length = (size_type)this;
    iVar7 = RegEx::Match<YAML::StreamCharSource>(&Exp::Blank::e,(StreamCharSource *)&local_a0);
    local_80 = (RegEx *)CONCAT71(local_80._1_7_,-1 < iVar7);
    CVar1 = INPUT->m_charSet;
    uVar13 = (ulong)CVar1;
    uVar16 = (uint)(byte)local_60;
    if (CVar1 != utf16le || (int)local_70 != 0) {
      uVar16 = (uint)(byte)local_48;
    }
    if (iVar6 < 0) {
      uVar16 = (uint)(byte)local_48;
    }
    local_48 = (ulong)uVar16;
    if (bVar18) {
      if (CVar1 == utf8) {
LAB_00723407:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else if (CVar1 == utf16be) {
        if ((-1 < iVar6) || ((((byte)local_74 | (byte)local_68) & 1) == 0)) goto LAB_00723407;
      }
      else if (CVar1 == utf16le) {
        if (((((iVar6 < 0) && ((local_68 & 1) == 0)) && (iVar7 < 0)) && ((local_60 & 1) == 0)) ||
           (iVar6 < 0)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        else {
          local_70 = (ulong)((int)local_70 + 1);
        }
        if ((iVar6 < 0) && (0 < (int)local_70)) {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_a0,(char)local_70 + -1);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (((local_48 & 1) != 0) || ((bool)~bVar3 || (char)local_80 != '\0')) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          local_70 = 0;
        }
      }
    }
    bVar4 = true;
    uVar14 = (undefined7)(uVar13 >> 8);
    if (iVar6 < 0) {
      bVar18 = true;
      bVar4 = (INPUT->m_mark).line <= *(int *)(this + 0x10);
      if (!bVar4) {
        *(undefined1 *)
         &(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = 1;
      }
      local_60 = CONCAT71(uVar14,(char)local_80);
      local_68 = CONCAT71(uVar14,-1 < iVar6);
    }
    else {
      local_60 = CONCAT71(uVar14,(char)local_80);
      local_68 = CONCAT71(uVar14,-1 < iVar6);
      bVar18 = true;
    }
LAB_00723116:
  } while (bVar4);
  pRVar8 = local_40;
  if (*(char *)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_map == '\x01') {
    pRVar10 = (RegEx *)std::__cxx11::string::find_last_not_of
                                 ((char *)__return_storage_ptr__,0x76b7c2,0xffffffffffffffff);
    pRVar9 = pRVar8;
    if (pRVar8 < pRVar10) {
      pRVar9 = pRVar10;
    }
    if (pRVar10 == (RegEx *)0xffffffffffffffff) {
      pRVar9 = pRVar8;
    }
    if (pRVar8 == (RegEx *)0xffffffffffffffff) {
      pRVar9 = pRVar10;
    }
    if (pRVar9 < (RegEx *)__return_storage_ptr__->_M_string_length) {
      pRVar9 = (RegEx *)((long)&pRVar9->m_op + 1);
      if ((RegEx *)__return_storage_ptr__->_M_string_length < pRVar9) {
        uVar12 = std::__throw_out_of_range_fmt
                           ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                            "basic_string::erase");
        __cxa_guard_abort(&Exp::Empty()::e);
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != local_38) {
          operator_delete(pcVar2);
        }
        _Unwind_Resume(uVar12);
      }
      __return_storage_ptr__->_M_string_length = (size_type)pRVar9;
      *(char *)((long)&pRVar9->m_op + (long)(__return_storage_ptr__->_M_dataplus)._M_p) = '\0';
    }
  }
  iVar6 = *(int *)((long)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                          _M_impl.super__Deque_impl_data._M_map + 4);
  if (iVar6 == -1) {
LAB_007236a4:
    pRVar10 = (RegEx *)std::__cxx11::string::find_last_not_of(cVar17,10);
    pRVar9 = pRVar8;
    if (pRVar8 < pRVar10) {
      pRVar9 = pRVar10;
    }
    if (pRVar10 == (RegEx *)0xffffffffffffffff) {
      pRVar9 = pRVar8;
    }
    if (pRVar8 == (RegEx *)0xffffffffffffffff) {
      pRVar9 = pRVar10;
    }
    if (pRVar9 == (RegEx *)0xffffffffffffffff) {
LAB_007236ef:
      __return_storage_ptr__->_M_string_length = 0;
      pbVar15 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
      goto LAB_007236fa;
    }
    if ((RegEx *)__return_storage_ptr__->_M_string_length <= pRVar9) {
      return __return_storage_ptr__;
    }
    pbVar15 = (byte *)((long)&pRVar9->m_op + 1);
  }
  else {
    if (iVar6 != 0) {
      return __return_storage_ptr__;
    }
    pRVar10 = (RegEx *)std::__cxx11::string::find_last_not_of(cVar17,10);
    pRVar9 = pRVar8;
    if (pRVar8 < pRVar10) {
      pRVar9 = pRVar10;
    }
    if (pRVar10 == (RegEx *)0xffffffffffffffff) {
      pRVar9 = pRVar8;
    }
    if (pRVar8 == (RegEx *)0xffffffffffffffff) {
      pRVar9 = pRVar10;
    }
    if (pRVar9 == (RegEx *)0xffffffffffffffff) goto LAB_007236ef;
    if ((undefined1 *)__return_storage_ptr__->_M_string_length <= (byte *)((long)&pRVar9->m_op + 1U)
       ) {
      return __return_storage_ptr__;
    }
    pbVar15 = (byte *)((long)&pRVar9->m_op + 2);
    if ((undefined1 *)__return_storage_ptr__->_M_string_length < pbVar15) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      goto LAB_007236a4;
    }
  }
  __return_storage_ptr__->_M_string_length = (size_type)pbVar15;
  pbVar15 = pbVar15 + (long)(__return_storage_ptr__->_M_dataplus)._M_p;
LAB_007236fa:
  *pbVar15 = 0;
  return __return_storage_ptr__;
LAB_00723884:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
LAB_00723899:
  iVar6 = __cxa_guard_acquire(&Exp::Empty()::e);
  if (iVar6 != 0) {
    RegEx::RegEx((RegEx *)Exp::Empty()::e);
    __cxa_atexit(RegEx::~RegEx,Exp::Empty()::e,&__dso_handle);
    __cxa_guard_release(&Exp::Empty()::e);
  }
  goto LAB_00722e4d;
}

Assistant:

std::string ScanScalar(Stream& INPUT, ScanScalarParams& params) {
  bool foundNonEmptyLine = false;
  bool pastOpeningBreak = (params.fold == FOLD_FLOW);
  bool emptyLine = false, moreIndented = false;
  int foldedNewlineCount = 0;
  bool foldedNewlineStartedMoreIndented = false;
  std::size_t lastEscapedChar = std::string::npos;
  std::string scalar;
  params.leadingSpaces = false;

  if (!params.end) {
    params.end = &Exp::Empty();
  }

  while (INPUT) {
    // ********************************
    // Phase #1: scan until line ending

    std::size_t lastNonWhitespaceChar = scalar.size();
    bool escapedNewline = false;
    while (!params.end->Matches(INPUT) && !Exp::Break().Matches(INPUT)) {
      if (!INPUT) {
        break;
      }

      // document indicator?
      if (INPUT.column() == 0 && Exp::DocIndicator().Matches(INPUT)) {
        if (params.onDocIndicator == BREAK) {
          break;
        }
        if (params.onDocIndicator == THROW) {
          throw ParserException(INPUT.mark(), ErrorMsg::DOC_IN_SCALAR);
        }
      }

      foundNonEmptyLine = true;
      pastOpeningBreak = true;

      // escaped newline? (only if we're escaping on slash)
      if (params.escape == '\\' && Exp::EscBreak().Matches(INPUT)) {
        // eat escape character and get out (but preserve trailing whitespace!)
        INPUT.get();
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        escapedNewline = true;
        break;
      }

      // escape this?
      if (INPUT.peek() == params.escape) {
        scalar += Exp::Escape(INPUT);
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        continue;
      }

      // otherwise, just add the damn character
      char ch = INPUT.get();
      scalar += ch;
      if (ch != ' ' && ch != '\t') {
        lastNonWhitespaceChar = scalar.size();
      }
    }

    // eof? if we're looking to eat something, then we throw
    if (!INPUT) {
      if (params.eatEnd) {
        throw ParserException(INPUT.mark(), ErrorMsg::EOF_IN_SCALAR);
      }
      break;
    }

    // doc indicator?
    if (params.onDocIndicator == BREAK && INPUT.column() == 0 &&
        Exp::DocIndicator().Matches(INPUT)) {
      break;
    }

    // are we done via character match?
    int n = params.end->Match(INPUT);
    if (n >= 0) {
      if (params.eatEnd) {
        INPUT.eat(n);
      }
      break;
    }

    // do we remove trailing whitespace?
    if (params.fold == FOLD_FLOW)
      scalar.erase(lastNonWhitespaceChar);

    // ********************************
    // Phase #2: eat line ending
    n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // ********************************
    // Phase #3: scan initial spaces

    // first the required indentation
    while (INPUT.peek() == ' ' &&
           (INPUT.column() < params.indent ||
            (params.detectIndent && !foundNonEmptyLine)) &&
           !params.end->Matches(INPUT)) {
      INPUT.eat(1);
    }

    // update indent if we're auto-detecting
    if (params.detectIndent && !foundNonEmptyLine) {
      params.indent = std::max(params.indent, INPUT.column());
    }

    // and then the rest of the whitespace
    while (Exp::Blank().Matches(INPUT)) {
      // we check for tabs that masquerade as indentation
      if (INPUT.peek() == '\t' && INPUT.column() < params.indent &&
          params.onTabInIndentation == THROW) {
        throw ParserException(INPUT.mark(), ErrorMsg::TAB_IN_INDENTATION);
      }

      if (!params.eatLeadingWhitespace) {
        break;
      }

      if (params.end->Matches(INPUT)) {
        break;
      }

      INPUT.eat(1);
    }

    // was this an empty line?
    bool nextEmptyLine = Exp::Break().Matches(INPUT);
    bool nextMoreIndented = Exp::Blank().Matches(INPUT);
    if (params.fold == FOLD_BLOCK && foldedNewlineCount == 0 && nextEmptyLine)
      foldedNewlineStartedMoreIndented = moreIndented;

    // for block scalars, we always start with a newline, so we should ignore it
    // (not fold or keep)
    if (pastOpeningBreak) {
      switch (params.fold) {
        case DONT_FOLD:
          scalar += "\n";
          break;
        case FOLD_BLOCK:
          if (!emptyLine && !nextEmptyLine && !moreIndented &&
              !nextMoreIndented && INPUT.column() >= params.indent) {
            scalar += " ";
          } else if (nextEmptyLine) {
            foldedNewlineCount++;
          } else {
            scalar += "\n";
          }

          if (!nextEmptyLine && foldedNewlineCount > 0) {
            scalar += std::string(foldedNewlineCount - 1, '\n');
            if (foldedNewlineStartedMoreIndented ||
                nextMoreIndented | !foundNonEmptyLine) {
              scalar += "\n";
            }
            foldedNewlineCount = 0;
          }
          break;
        case FOLD_FLOW:
          if (nextEmptyLine) {
            scalar += "\n";
          } else if (!emptyLine && !escapedNewline) {
            scalar += " ";
          }
          break;
      }
    }

    emptyLine = nextEmptyLine;
    moreIndented = nextMoreIndented;
    pastOpeningBreak = true;

    // are we done via indentation?
    if (!emptyLine && INPUT.column() < params.indent) {
      params.leadingSpaces = true;
      break;
    }
  }

  // post-processing
  if (params.trimTrailingSpaces) {
    std::size_t pos = scalar.find_last_not_of(" \t");
    if (lastEscapedChar != std::string::npos) {
      if (pos < lastEscapedChar || pos == std::string::npos) {
        pos = lastEscapedChar;
      }
    }
    if (pos < scalar.size()) {
      scalar.erase(pos + 1);
    }
  }

  switch (params.chomp) {
    case CLIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos + 1 < scalar.size()) {
        scalar.erase(pos + 2);
      }
    } break;
    case STRIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos < scalar.size()) {
        scalar.erase(pos + 1);
      }
    } break;
    default:
      break;
  }

  return scalar;
}